

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::setCapacity
          (Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,size_t newSize)

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar2;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar3;
  __off_t in_RDX;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> newBuilder;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> local_38;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 4)) {
    ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x10,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pMVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pMVar3 = (this->builder).ptr; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    ((local_38.pos)->ptr).disposer = (pMVar3->ptr).disposer;
    ((local_38.pos)->ptr).ptr = (pMVar3->ptr).ptr;
    (pMVar3->ptr).ptr = (ClientHook *)0x0;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator=(&this->builder,&local_38);
  pMVar1 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pMVar3 = local_38.ptr;
  if (local_38.ptr != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    local_38.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    local_38.pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
    local_38.endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pMVar3,0x10,(long)pRVar2 - (long)pMVar3 >> 4,
               (long)pMVar1 - (long)pMVar3 >> 4,
               ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }